

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O0

int dlep_writer_finish_signal(dlep_writer *writer,oonf_log_source source)

{
  char *pcVar1;
  uint16_t uVar2;
  ulong uVar3;
  char *dst;
  uint16_t tmp16;
  size_t length;
  oonf_log_source source_local;
  dlep_writer *writer_local;
  
  if ((writer->out->_error & 1U) == 0) {
    uVar3 = writer->out->_len - writer->signal_start;
    if (uVar3 < 0x10004) {
      uVar2 = htons((short)uVar3 - 4);
      pcVar1 = writer->out->_buf;
      *(uint16_t *)(pcVar1 + writer->signal_start + 2) = uVar2;
      if (((&log_global_mask)[source] & 1) != 0) {
        oonf_log(1,source,"src/generic/dlep/dlep_writer.c",0x8b,pcVar1 + writer->signal_start,uVar3,
                 "Finished signal %u:",writer->signal_type);
      }
      writer_local._4_4_ = 0;
    }
    else {
      if (((&log_global_mask)[source] & 4) != 0) {
        oonf_log(4,source,"src/generic/dlep/dlep_writer.c",0x80,0,0,"Signal %u became too long: %zu"
                 ,writer->signal_type,writer->out->_len);
      }
      writer_local._4_4_ = -1;
    }
  }
  else {
    if (((&log_global_mask)[source] & 4) != 0) {
      oonf_log(4,source,"src/generic/dlep/dlep_writer.c",0x79,0,0,"Could not build signal: %u",
               writer->signal_type);
    }
    writer_local._4_4_ = -1;
  }
  return writer_local._4_4_;
}

Assistant:

int
dlep_writer_finish_signal(struct dlep_writer *writer, enum oonf_log_source source) {
  size_t length;
  uint16_t tmp16;
  char *dst;

  if (abuf_has_failed(writer->out)) {
    OONF_WARN(source, "Could not build signal: %u", writer->signal_type);
    return -1;
  }

  length = abuf_getlen(writer->out) - writer->signal_start;
  if (length > 65535 + 4) {
    OONF_WARN(
      source, "Signal %u became too long: %" PRINTF_SIZE_T_SPECIFIER, writer->signal_type, abuf_getlen(writer->out));
    return -1;
  }

  /* calculate network ordered size */
  tmp16 = htons(length - 4);

  /* put it into the signal */
  dst = abuf_getptr(writer->out);
  memcpy(&dst[writer->signal_start + 2], &tmp16, sizeof(tmp16));

  OONF_DEBUG_HEX(source, &dst[writer->signal_start], length, "Finished signal %u:", writer->signal_type);
  return 0;
}